

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.h
# Opt level: O0

long __thiscall
MathML::AST::ConstantExpression::unaryOperation<long>
          (ConstantExpression *this,long *operand,Operator op)

{
  ostream *poVar1;
  Error *this_00;
  Operator in_EDX;
  ulong *in_RSI;
  long in_RDI;
  bool bVar2;
  Error error;
  ostringstream oss;
  ErrorCode errorCode;
  string local_1f8 [32];
  undefined1 local_1d8 [64];
  ostringstream local_198 [380];
  Operator local_1c;
  ulong *local_18;
  ulong local_8;
  
  if (in_EDX == ADD) {
    local_8 = *in_RSI;
  }
  else if (in_EDX == SUB) {
    local_8 = -*in_RSI;
  }
  else if (in_EDX == NOT) {
    local_8 = (ulong)((*in_RSI != 0 ^ 0xffU) & 1);
  }
  else {
    local_1c = in_EDX;
    local_18 = in_RSI;
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"invalid operator: ");
    this_00 = (Error *)UnaryExpression::operatorString_abi_cxx11_(local_1c);
    poVar1 = std::operator<<(poVar1,(string *)this_00);
    std::operator<<(poVar1,", cause operand not of type \'bool\' [f, t]");
    errorCode = (ErrorCode)((ulong)poVar1 >> 0x20);
    bVar2 = *(long *)(in_RDI + 0x38) == 0;
    if (!bVar2) {
      std::__cxx11::ostringstream::str();
      Error::Error(this_00,errorCode,(String *)0xc90830);
      std::__cxx11::string::~string(local_1f8);
      (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))(*(long **)(in_RDI + 0x38),local_1d8);
      local_8 = *local_18;
      Error::~Error((Error *)0xc9087a);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    if (bVar2) {
      local_8 = *local_18;
    }
  }
  return local_8;
}

Assistant:

T ConstantExpression::unaryOperation( const T& operand, UnaryExpression::Operator op ) const
        {
            switch ( op )
            {

            case AST::UnaryExpression::ADD:
                //do nothing
                return operand;

            case AST::UnaryExpression::SUB:
                return ( -operand );

            case AST::UnaryExpression::NOT:
                return ( !operand );

            default:
                std::ostringstream oss;
                oss << "invalid operator: " << AST::UnaryExpression::operatorString( op ) << ", cause operand not of type 'bool' [f, t]";
                if ( mErrorHandler )
                {
                    Error error( Error::ERR_INVALIDPARAMS, oss.str() );
                    mErrorHandler->handleError( &error );
                    return operand;
                }
            }
            return operand;
        }